

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_vox.cpp
# Opt level: O3

void demo_merge_scenes(void)

{
  ogt_vox_scene *scene;
  uint32_t scene_index;
  long lVar1;
  ogt_vox_scene *scenes [6];
  ogt_vox_scene *local_48 [7];
  
  lVar1 = 0;
  local_48[0] = load_vox_scene("vox/chr_old.vox",0);
  local_48[1] = load_vox_scene("vox/chr_rain.vox",0);
  local_48[2] = load_vox_scene("vox/chr_sword.vox",0);
  local_48[3] = load_vox_scene("vox/chr_knight.vox",0);
  local_48[4] = load_vox_scene("vox/doom.vox",0);
  local_48[5] = load_vox_scene("vox/test_groups.vox",1);
  scene = ogt_vox_merge_scenes(local_48,6,(ogt_vox_rgba *)0x0,0);
  save_vox_scene("merged.vox",scene);
  ogt_vox_destroy_scene(scene);
  do {
    if (local_48[lVar1] != (ogt_vox_scene *)0x0) {
      ogt_vox_destroy_scene(local_48[lVar1]);
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 6);
  return;
}

Assistant:

void demo_merge_scenes()
{
    const ogt_vox_scene* scenes[] = {
        load_vox_scene("vox/chr_old.vox"),
        load_vox_scene("vox/chr_rain.vox"),
        load_vox_scene("vox/chr_sword.vox"),
        load_vox_scene("vox/chr_knight.vox"),
        load_vox_scene("vox/doom.vox"),
        load_vox_scene_with_groups("vox/test_groups.vox"),
    };
    const uint32_t k_scene_count = sizeof(scenes) / sizeof(scenes[0]);

    bool use_explicit_output_palette = false;

    // construct the merged scenes from the above loaded scenes.
    ogt_vox_scene* merged_scene = NULL;
    if (use_explicit_output_palette) {
        // this scene controls the explicit output palette of the merged scenes.
        const ogt_vox_scene* palette_scene = load_vox_scene("merge_src/test_palette_remap.vox");
        merged_scene = ogt_vox_merge_scenes(scenes, k_scene_count, &palette_scene->palette.color[1], 255);
        ogt_vox_destroy_scene(palette_scene);
    }
    else {
        // instead of using an explicit palette, merge scenes will combine all source scene palettes as best as it can.
        // This works best if there is a fair amount of overlap in each of the scenes colors, and/or if all scenes
        // only use a small subset of the colors in their own palette.
        merged_scene = ogt_vox_merge_scenes(scenes, k_scene_count, NULL, 0);
    }

    // save the merged scene to disk, and destroy it.
    save_vox_scene("merged.vox", merged_scene);
    ogt_vox_destroy_scene(merged_scene);

    // destroy our source scenes
    for (uint32_t scene_index = 0; scene_index < k_scene_count; scene_index++) {
        if (scenes[scene_index])
            ogt_vox_destroy_scene(scenes[scene_index]);
    }
}